

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.h
# Opt level: O2

bool asmjit::CodeWriterUtils::encodeOffset32(uint32_t *dst,int64_t offset64,OffsetFormat *format)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint32_t uVar4;
  
  bVar1 = format->_immBitCount;
  if ((bVar1 == 0) || ((uint)format->_valueSize * 8 < (uint)bVar1)) {
    return false;
  }
  bVar2 = format->_immDiscardLsb;
  if (bVar2 != 0) {
    if (0x20 < bVar2) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/codewriter.cpp"
                 ,0x27,"discardLsb <= 32");
    }
    if (((~(uint)(-1L << (bVar2 & 0x3f)) | 1) & (uint)offset64) != 0) {
      return false;
    }
    offset64 = offset64 >> (bVar2 & 0x3f);
  }
  uVar3 = (uint)offset64;
  if ((int)uVar3 != offset64) {
    return false;
  }
  if ((int)(uVar3 << (-bVar1 & 0x1f)) >> (-bVar1 & 0x1f) == uVar3) {
    if (format->_type - 1 < 2) {
      if (format->_immBitShift != 5) {
        return false;
      }
      if (bVar1 != 0x15) {
        return false;
      }
      if (format->_valueSize != 4) {
        return false;
      }
      uVar4 = (uVar3 & 3) * 0x20000000 + (uVar3 & 0x1ffffc) * 8;
    }
    else {
      if (format->_type != 0) {
        return false;
      }
      uVar4 = (uVar3 & ~(uint)(-1L << (bVar1 & 0x3f))) << (format->_immBitShift & 0x1f);
    }
    *dst = uVar4;
    return true;
  }
  return false;
}

Assistant:

inline uint32_t immBitCount() const noexcept { return _immBitCount; }